

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

bool __thiscall
GraphPropagator::coherence_outedges
          (GraphPropagator *this,int node,vector<int,_std::allocator<int>_> *remvd_e)

{
  byte bVar1;
  pointer pvVar2;
  iterator __position;
  bool bVar3;
  undefined4 uVar4;
  uint uVar5;
  ulong uVar6;
  BoolView *pBVar7;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  ulong uVar8;
  pointer piVar9;
  size_t __size;
  edge_id edge;
  Clause *expl;
  uint local_4c;
  anon_union_8_2_743a5d44_for_Reason_0 local_48;
  void *pvStack_40;
  Clause *local_38;
  
  pvVar2 = (this->adj).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar9 = pvVar2[node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar2[node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + 8) != piVar9) {
    uVar6 = 0;
    uVar8 = 1;
    do {
      local_4c = piVar9[uVar6];
      uVar6 = (ulong)local_4c;
      pBVar7 = (this->es).data;
      uVar5 = pBVar7[uVar6].v;
      bVar1 = sat.assigns.data[uVar5];
      if (bVar1 == 0) {
        if (so.lazy == true) {
          local_48._pt = (Clause *)malloc(0x10);
          *(uint *)local_48._pt = 0x202;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_48._pt);
          if (*(uint *)local_48._pt < 0x200) {
            abort();
          }
          uVar5 = (this->vs).data[(uint)node].v;
          *(uint *)(local_48._a + 8) =
               (uint)((int)sat.assigns.data[uVar5] - 1U < 0xfffffffd) + uVar5 * 2;
          uVar6 = (ulong)local_4c;
          pBVar7 = (this->es).data;
          uVar5 = pBVar7[uVar6].v;
          r = local_48;
        }
        else {
          r._pt = (Clause *)0x0;
        }
        SAT::enqueue(&sat,(Lit)((pBVar7[uVar6].s ^ 1) + uVar5 * 2),(Reason)r);
        __position._M_current =
             (remvd_e->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (remvd_e->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)remvd_e,__position,(int *)&local_4c);
        }
        else {
          *__position._M_current = local_4c;
          (remvd_e->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
        }
      }
      else if (((uint)pBVar7[uVar6].s ^
               (int)(char)((((int)(short)(char)bVar1 + 1U & 0xffff) >> 0xf) + (int)(char)bVar1 + 1
                          >> 1)) == 1) {
        if (so.lazy == true) {
          local_48._pt = (Clause *)0x0;
          pvStack_40 = (void *)0x0;
          local_38._0_4_ = (uint)(bVar1 < 0xfe) + uVar5 * 2;
          vec<Lit>::push((vec<Lit> *)&local_48,(Lit *)&local_38);
          uVar5 = (this->vs).data[(uint)node].v;
          local_38 = (Clause *)
                     CONCAT44(local_38._4_4_,
                              (uint)((int)sat.assigns.data[uVar5] - 1U < 0xfffffffd) + uVar5 * 2);
          vec<Lit>::push((vec<Lit> *)&local_48,(Lit *)&local_38);
          uVar4 = local_48._a._0_4_;
          uVar6 = local_48._a & 0xffffffff;
          __size = 8;
          if (local_48._a._0_4_ != 0) {
            __size = (ulong)(local_48._a._0_4_ - 1) * 4 + 8;
          }
          local_38 = (Clause *)malloc(__size);
          local_38->data[0].x = -2;
          if (uVar4 != 0) {
            uVar8 = 0;
            do {
              local_38->data[uVar8].x = *(int *)((long)pvStack_40 + uVar8 * 4);
              uVar8 = uVar8 + 1;
            } while (uVar6 != uVar8);
          }
          *(uint *)local_38 = uVar4 << 8 | 2;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
          sat.confl = local_38;
          if (pvStack_40 != (void *)0x0) {
            free(pvStack_40);
          }
        }
        return false;
      }
      pvVar2 = (this->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar9 = pvVar2[node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar3 = uVar8 < (ulong)((long)*(pointer *)
                                     ((long)&pvVar2[node].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data + 8) - (long)piVar9 >> 2);
      uVar6 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar3);
  }
  return true;
}

Assistant:

bool GraphPropagator::coherence_outedges(int node, std::vector<edge_id>& remvd_e) {
	for (unsigned int i = 0; i < adj[node].size(); i++) {
		const edge_id edge = adj[node][i];
		// Edge with missing an endnode
		if (es[edge].isFixed() && es[edge].getVal() == 1) {
			if (so.lazy) {
				vec<Lit> ps;
				ps.push(es[edge].getValLit());
				ps.push(vs[node].getValLit());
				Clause* expl = Clause_new(ps);
				expl->temp_expl = 1;
				sat.rtrail.last().push(expl);
				sat.confl = expl;
			}
			return false;
		}
		// Edge that must be removed
		if (!es[edge].isFixed()) {
			Clause* r = nullptr;
			if (so.lazy) {
				r = Reason_new(2);
				(*r)[1] = vs[node].getValLit();
			}
			if (GRAPHPROP_DEBUG) {
				std::cout << "COHERENCE (E) " << edge << '\n';
			}
			es[edge].setVal2(false, r);
			remvd_e.push_back(edge);
		}
	}
	return true;
}